

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fn.hpp
# Opt level: O0

group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq> *
rangeless::fn::in_groups_of
          (group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>
           *__return_storage_ptr__,size_t n)

{
  logic_error *this;
  __cxx11 local_e0 [48];
  string local_b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30 [32];
  size_t local_10;
  size_t n_local;
  
  if (n == 0) {
    local_10 = n;
    this = (logic_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string(local_b0);
    std::operator+(local_90,(char *)local_b0);
    std::operator+(local_70,(char *)local_90);
    std::__cxx11::to_string(local_e0,0x1055);
    std::operator+(local_50,local_70);
    std::operator+(local_30,(char *)local_50);
    std::logic_error::logic_error(this,(string *)local_30);
    __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  (__return_storage_ptr__->key_fn).chunk_size = n;
  (__return_storage_ptr__->key_fn).n_calls = 0;
  return __return_storage_ptr__;
}

Assistant:

inline impl::group_adjacent_by<impl::chunker> in_groups_of(size_t n)
    {
        if(n < 1) {
            RANGELESS_FN_THROW("Batch size must be at least 1.");
        }
        return { impl::chunker{ n, 0 }, {} };
    }